

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
          (exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *this,int k,
          vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          *constraint_elements,int bk_min,int bk_max)

{
  int iVar1;
  size_type __new_size;
  reference pvVar2;
  const_reference pvVar3;
  int local_7c;
  int local_4c;
  int local_48;
  int local_44;
  int j_1;
  int j;
  int sum;
  int i;
  bool end;
  int iStack_30;
  int nb_solution;
  int start_it_flat_constraints;
  int constraint_size;
  int bk_max_local;
  int bk_min_local;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
  *constraint_elements_local;
  exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *peStack_10;
  int k_local;
  exhaustive_solver<baryonyx::itm::minimize_tag,_long_double> *this_local;
  
  start_it_flat_constraints = bk_max;
  constraint_size = bk_min;
  _bk_max_local = constraint_elements;
  constraint_elements_local._4_4_ = k;
  peStack_10 = this;
  nb_solution = length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                          (constraint_elements);
  iStack_30 = length<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)(this + 0x18));
  i = 0;
  if (constraint_elements_local._4_4_ < 0) {
    details::fail_fast("Postcondition","k >= 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"121");
  }
  if (nb_solution < 1) {
    details::fail_fast("Postcondition","constraint_size > 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"122");
  }
  __new_size = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::size(_bk_max_local);
  sum._3_1_ = 0;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30),__new_size,
             (value_type_conflict *)((long)&sum + 3));
  pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::back
                     ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30));
  *pvVar2 = '\x01';
  sum._2_1_ = 0;
  do {
    iVar1 = length<std::vector<signed_char,std::allocator<signed_char>>>
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30));
    j = iVar1 + -1;
    do {
      j_1 = 0;
      for (local_44 = 0; local_44 != nb_solution; local_44 = local_44 + 1) {
        pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30),
                            (long)local_44);
        if (*pvVar2 != '\0') {
          pvVar3 = std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   operator[](_bk_max_local,(long)local_44);
          j_1 = pvVar3->factor + j_1;
        }
      }
      if ((constraint_size <= j_1) && (j_1 <= start_it_flat_constraints)) {
        i = i + 1;
        for (local_48 = 0; local_48 != nb_solution; local_48 = local_48 + 1) {
          pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30),
                              (long)local_48);
          if (*pvVar2 == '\0') {
            local_7c = 0;
          }
          else {
            pvVar3 = std::
                     vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ::operator[](_bk_max_local,(long)local_48);
            local_7c = pvVar3->factor;
          }
          local_4c = local_7c;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)(this + 0x18),&local_4c);
        }
      }
      pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30),(long)j
                         );
      *pvVar2 = *pvVar2 + '\x01';
      pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30),(long)j
                         );
      if (*pvVar2 < '\x02') break;
      pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(this + 0x30),(long)j
                         );
      *pvVar2 = '\0';
      if (j == 0) {
        sum._2_1_ = 1;
        break;
      }
      j = j + -1;
    } while (((sum._2_1_ ^ 0xff) & 1) != 0);
    if (((sum._2_1_ ^ 0xff) & 1) == 0) {
      if (iStack_30 < 0) {
        details::fail_fast("Precondition","start_it_flat_constraints >= 0",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                           ,"162");
      }
      if (0 < i) {
        std::
        set<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::constraint,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::constraint>>
        ::emplace<int&,int_const&,int&,int&,int&>
                  ((set<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::constraint,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::constraint>>
                    *)(this + 0x48),(int *)((long)&constraint_elements_local + 4),
                   &stack0xffffffffffffffd0,&i,&constraint_size,&start_it_flat_constraints);
        return;
      }
      details::fail_fast("Precondition","nb_solution > 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                         ,"163");
    }
  } while( true );
}

Assistant:

void build_constraints(int k,
                           const C& constraint_elements,
                           int bk_min,
                           int bk_max)
    {
        const auto constraint_size = length(constraint_elements);
        const auto start_it_flat_constraints = length(flat_constraints);
        auto nb_solution = 0;

        bx_ensures(k >= 0);
        bx_ensures(constraint_size > 0);

        walkers.resize(constraint_elements.size(), 0);
        walkers.back() = 1;
        bool end = false;

        do {
            auto i = length(walkers) - 1;

            do {
                int sum = 0;
                for (int j = 0; j != constraint_size; ++j)
                    if (walkers[j])
                        sum += constraint_elements[j].factor;

                if (bk_min <= sum && sum <= bk_max) {
                    ++nb_solution;
                    for (int j = 0; j != constraint_size; ++j) {
                        flat_constraints.emplace_back(
                          walkers[j] ? constraint_elements[j].factor : 0);
                    }
                }

                ++walkers[i];

                if (walkers[i] > 1) {
                    walkers[i] = 0;

                    if (i == 0) {
                        end = true;
                        break;
                    } else {
                        --i;
                    }
                } else {
                    break;
                }
            } while (!end);
        } while (!end);

        bx_expects(start_it_flat_constraints >= 0);
        bx_expects(nb_solution > 0);

        constraints.emplace(
          k, start_it_flat_constraints, nb_solution, bk_min, bk_max);
    }